

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t delta)

{
  bool bVar1;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  long in_RDI;
  bool result;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (in_RSI < *(StringBase<char,_axl::sl::StringDetailsBase<char>_> **)(in_RDI + 0x10)) {
    bVar1 = overrideLength(in_RSI,CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
  }
  else {
    clear((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
          CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  return *(size_t *)(in_RDI + 0x10);
}

Assistant:

size_t
	chop(size_t delta) {
		if (this->m_length <= delta) {
			clear();
		} else {
			bool result = overrideLength(this->m_length - delta);
			if (!result)
				return -1;
		}

		return this->m_length;
	}